

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&> * __thiscall
Catch::ExprLhs<std::bitset<512ul>const&>::operator==
          (BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&>
           *__return_storage_ptr__,ExprLhs<std::bitset<512ul>const&> *this,bitset<512UL> *rhs)

{
  bitset<512UL> *pbVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  StringRef local_38;
  
  pbVar1 = *(bitset<512UL> **)this;
  if ((pbVar1->super__Base_bitset<8UL>)._M_w[0] == (rhs->super__Base_bitset<8UL>)._M_w[0]) {
    uVar2 = 0;
    do {
      uVar3 = uVar2;
      if (uVar3 == 7) break;
      uVar2 = uVar3 + 1;
    } while ((pbVar1->super__Base_bitset<8UL>)._M_w[uVar3 + 1] ==
             (rhs->super__Base_bitset<8UL>)._M_w[uVar3 + 1]);
    bVar4 = 6 < uVar3;
  }
  else {
    bVar4 = false;
  }
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar4;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00b321f0;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }